

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O0

void __thiscall imrt::ACO::evaporation(ACO *this)

{
  int iVar1;
  Matrix *in_RDI;
  Matrix *pMVar2;
  int a;
  int s;
  Matrix *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar3;
  double in_stack_ffffffffffffffc0;
  Matrix *in_stack_ffffffffffffffc8;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  *in_stack_ffffffffffffffd0;
  Matrix local_10;
  
  local_10.cols_ = 0;
  while( true ) {
    iVar3 = local_10.cols_;
    iVar1 = Collimator::getNbAngles((Collimator *)in_RDI[0xf].p);
    if (iVar1 <= iVar3) break;
    for (local_10.rows_ = 0; local_10.rows_ < in_RDI[0x10].rows_;
        local_10.rows_ = local_10.rows_ + 1) {
      pMVar2 = in_RDI + 2;
      std::
      vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
      ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                    *)&pMVar2->p,(long)local_10.cols_);
      this_00 = &local_10;
      std::
      map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::operator[](in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->rows_);
      maths::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      std::
      vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
      ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                    *)&pMVar2->p,(long)local_10.cols_);
      std::
      map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::operator[](in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->rows_);
      maths::Matrix::operator=(in_RDI,(Matrix *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      maths::Matrix::~Matrix(this_00);
      pMVar2 = in_RDI + 7;
      std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)pMVar2,
                 (long)local_10.cols_);
      maths::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)pMVar2,
                 (long)local_10.cols_);
      maths::Matrix::operator=(in_RDI,(Matrix *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      maths::Matrix::~Matrix(this_00);
    }
    local_10.cols_ = local_10.cols_ + 1;
  }
  return;
}

Assistant:

void evaporation () {
    for (int s =0 ; s< collimator.getNbAngles();s++) 
      for (int a=0; a<max_apertures;a++) {
        pheromone[s][a] =  pheromone[s][a] *(1.0-rho);
        ipheromone[s] = ipheromone[s] *(1.0-rho);
      }
  }